

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall SHA256_check::test_method(SHA256_check *this)

{
  int iVar1;
  string expected;
  string actual;
  ethash_h256_t input;
  ethash_h256_t out;
  undefined1 *local_1b0;
  size_t local_1a8;
  undefined1 local_1a0 [16];
  string local_190;
  pointer local_170;
  undefined1 *local_168;
  undefined1 local_160;
  undefined8 local_158;
  shared_count sStack_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  uint8_t local_118 [32];
  undefined **local_f8;
  undefined1 local_f0;
  undefined8 *local_e8;
  char *local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined ***local_c8;
  undefined1 **local_c0;
  undefined **local_b8;
  undefined1 local_b0;
  undefined ***local_a8;
  char *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined ***local_88;
  char *local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined ***local_68;
  pointer *local_60;
  undefined **local_58;
  undefined1 local_50;
  undefined ***local_48;
  char *local_40;
  uint8_t local_38 [32];
  
  builtin_memcpy(local_118,"~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~",0x20);
  sha3_256(local_38,0x20,local_118,0x20);
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,"2b5ddf6f4d21c23de216f44d5e4bdc68e044b71897837ea74c83908be7037cd7"
             ,"");
  bytesToHexString_abi_cxx11_(&local_190,local_38,0x20);
  local_128 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x80);
  if (local_1a8 == local_190._M_string_length) {
    if (local_1a8 == 0) {
      local_160 = true;
    }
    else {
      iVar1 = bcmp(local_1b0,local_190._M_dataplus._M_p,local_1a8);
      local_160 = iVar1 == 0;
    }
  }
  else {
    local_160 = false;
  }
  local_158 = 0;
  sStack_150.pi_ = (sp_counted_base *)0x0;
  local_c8 = &local_f8;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_0013e750;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = "\nexpected: ";
  local_c0 = &local_168;
  local_168 = local_1b0;
  local_a8 = &local_d8;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_0013e8d0;
  local_88 = &local_b8;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_0013e910;
  local_a0 = "\n";
  local_68 = &local_98;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_0013e950;
  local_80 = "actual: ";
  local_60 = &local_170;
  local_170 = local_190._M_dataplus._M_p;
  local_48 = &local_78;
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_0013e990;
  local_50 = 0;
  local_58 = &PTR__lazy_ostream_0013e9d0;
  local_40 = "\n";
  local_148 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_140 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SHA256_check) {
	ethash_h256_t input;
	ethash_h256_t out;
	memcpy(&input, "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);
	SHA3_256(&out, (uint8_t*)&input, 32);
	const std::string
			expected = "2b5ddf6f4d21c23de216f44d5e4bdc68e044b71897837ea74c83908be7037cd7",
		actual = bytesToHexString((uint8_t*)&out, 32);
	BOOST_REQUIRE_MESSAGE(expected == actual,
			"\nexpected: " << expected.c_str() << "\n"
					<< "actual: " << actual.c_str() << "\n");
}